

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,3>,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  pointer pVVar5;
  pointer pVVar6;
  Variable<tcu::Vector<float,_3>_> *pVVar7;
  pointer pcVar8;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar9;
  undefined8 uVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *pVVar11;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  MessageBuilder *pMVar23;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  undefined1 *puVar25;
  Vector<float,_3> *val;
  double dVar26;
  ulong uVar27;
  long lVar28;
  PrecisionCase *pPVar29;
  byte bVar30;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  outputs;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_548 [8];
  PrecisionCase *local_540;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *local_538;
  undefined1 local_530 [12];
  undefined4 uStack_524;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  ulong local_510;
  Statement *local_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [56];
  string local_4b8;
  double local_498;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_490;
  FloatFormat *local_488;
  ResultCollector *local_480;
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  double local_458;
  Data local_450;
  undefined4 local_440;
  ios_base local_408 [8];
  ios_base local_400 [264];
  FloatFormat local_2f8;
  ulong local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2c8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  local_298;
  undefined1 local_268 [16];
  _Base_ptr local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree_node_base *local_248;
  double local_240;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar30 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dVar26 = (double)(((long)pVVar6 - (long)pVVar5 >> 2) * -0x5555555555555555);
  local_508 = stmt;
  local_490 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  ::Outputs(&local_298,(size_t)dVar26);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2f8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2f8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2f8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2f8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2f8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2f8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2f8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2f8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2f8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c8._M_impl.super__Rb_tree_header._M_header;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_478._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_478 + 8);
  local_540 = this;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_508->_vptr_Statement[2])(local_508,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_538 = variables;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_400);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_268 + 8);
  local_268._8_4_ = _S_red;
  local_258 = (_Base_ptr)0x0;
  local_240 = 0.0;
  local_498 = dVar26;
  local_250 = p_Var3;
  local_248 = p_Var3;
  (*local_508->_vptr_Statement[4])(local_508,local_268);
  if (local_250 != p_Var3) {
    p_Var16 = local_250;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var3);
  }
  if (local_240 != 0.0) {
    local_478._0_8_ = ((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_478 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_500._0_8_,local_500._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_400);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  pPVar29 = local_540;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,"precision ",10);
  __s = glu::getPrecisionName((pPVar29->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_548 + *(long *)(local_478._0_8_ + -0x18)) + 0xd0);
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  pPVar29 = local_540;
  type.super_ApiType.m_bits =
       (ApiType)(*((local_540->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((pPVar29->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&pPVar29->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_468._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_468._8_8_ = plVar18[3];
      local_478._0_8_ = &local_468;
    }
    else {
      local_468._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_478._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_478._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._0_8_ != &local_468) {
      operator_delete((void *)local_478._0_8_,local_468._M_allocated_capacity + 1);
    }
    pPVar29 = local_540;
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_478,pPVar29,
             (local_538->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_478);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._0_8_ != &local_468) {
    operator_delete((void *)local_478._0_8_,local_468._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_478,local_540,
             (local_538->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_478);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  pPVar29 = local_540;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._0_8_ != &local_468) {
    operator_delete((void *)local_478._0_8_,local_468._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)local_478,pPVar29,
             (local_538->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_478);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._0_8_ != &local_468) {
    operator_delete((void *)local_478._0_8_,local_468._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  (*local_508->_vptr_Statement[2])(local_508,local_478);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar29 = local_540;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_540->m_ctx).renderContext,(local_540->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  dVar26 = local_498;
  local_478._0_8_ =
       (local_490->in0).
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_478._8_8_ =
       (local_490->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_468._M_allocated_capacity =
       (size_type)
       (local_490->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_468._8_8_ =
       (local_490->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_298.out0.
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_298.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar29->super_TestCase).super_TestNode.m_testCtx)->m_log);
  pVVar11 = local_538;
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,(ulong)dVar26 & 0xffffffff,local_478,local_1a8);
  local_488 = &(local_540->m_ctx).floatFormat;
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  lVar20 = 8;
  do {
    local_1a8[lVar20 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x50);
  lVar20 = 8;
  do {
    local_1a8[lVar20 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x50);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_478);
  lVar20 = 8;
  do {
    local_268[lVar20 + -8] = 0;
    *(undefined8 *)(local_268 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_268 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x50);
  lVar20 = 8;
  do {
    local_268[lVar20 + -8] = 0;
    *(undefined8 *)(local_268 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_268 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2c8,
             (pVVar11->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar11->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_500);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar11->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_530);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar11->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(local_4f0 + 0x38));
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_2c8,
             (pVVar11->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr,(IVal *)local_478);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2c8,
             (pVVar11->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_268);
  if (pVVar6 == pVVar5) {
LAB_008795af:
    local_478._0_8_ = ((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_478 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_480 = &local_540->m_status;
    local_2d0 = (long)dVar26 + (ulong)(dVar26 == 0.0);
    uVar27 = 0;
    local_510 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      lVar20 = 8;
      do {
        local_268[lVar20 + -8] = 0;
        *(undefined8 *)(local_268 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_268 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x50);
      lVar20 = 8;
      do {
        local_268[lVar20 + -8] = 0;
        *(undefined8 *)(local_268 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_268 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x50);
      if ((uVar27 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_540->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar5 = (local_490->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_530._8_4_ = pVVar5[uVar27].m_data[2];
      local_530._0_8_ = *(undefined8 *)pVVar5[uVar27].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_500,local_488,(Vector<float,_3> *)local_530);
      pVVar11 = local_538;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_478,local_488,(IVal *)local_500);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2c8,
                           (pVVar11->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar23 = (MessageBuilder *)local_478;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar30 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar11->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar11->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (pVVar11->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_450.basic.type = (local_540->m_ctx).precision;
      local_458 = local_488->m_maxValue;
      local_478._0_8_ = *(undefined8 *)local_488;
      local_478._8_8_ = *(undefined8 *)&local_488->m_fractionBits;
      local_468._M_allocated_capacity = *(undefined8 *)&local_488->m_hasInf;
      local_468._8_8_ = *(undefined8 *)&local_488->m_exactPrecision;
      local_440 = 0;
      local_450._8_8_ = &local_2c8;
      (*local_508->_vptr_Statement[3])(local_508,(MessageBuilder *)local_478);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2c8,
                           (pVVar11->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_478,&local_2f8,pIVar21);
      pMVar23 = (MessageBuilder *)local_478;
      pIVar21 = (IVal *)local_268;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar30 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_268,
                          local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar27);
      local_478._0_8_ = &local_468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Shader output 1 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_480,bVar12,(string *)local_478);
      pVVar11 = local_538;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._0_8_ != &local_468) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
      }
      pIVar22 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_2c8,
                           (pVVar11->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)local_478,&local_2f8,pIVar22);
      puVar25 = local_1a8;
      lVar20 = 0;
      pMVar23 = (MessageBuilder *)local_478;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar28 + 0x10) = *(undefined8 *)(&pMVar23->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar23->m_log + lVar28);
          uVar10 = puVar1[1];
          *(undefined8 *)(puVar25 + lVar28) = *puVar1;
          *(undefined8 *)((long)(puVar25 + lVar28) + 8) = uVar10;
          lVar28 = lVar28 + 0x48;
        } while (lVar28 != 0xd8);
        lVar20 = lVar20 + 1;
        puVar25 = puVar25 + 0x18;
        pMVar23 = (MessageBuilder *)&pMVar23->field_0x18;
      } while (lVar20 != 3);
      bVar13 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar27);
      local_478._0_8_ = &local_468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_480,bVar13,(string *)local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._0_8_ != &local_468) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
      }
      pVVar11 = local_538;
      if (!bVar12 || !bVar13) {
        uVar15 = (int)local_510 + 1;
        local_510 = (ulong)uVar15;
        if ((int)uVar15 < 0x65) {
          local_478._0_8_ = ((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_478 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar7 = (pVVar11->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          val = (Vector<float,_3> *)local_4f0;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_500._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_478 + 8),(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_478 + 8)," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     ((local_490->in0).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_478 + 8),(char *)local_530._0_8_,
                     CONCAT44(uStack_524,local_530._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_478 + 8),"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &local_520) {
            operator_delete((void *)local_530._0_8_,local_520._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_500._0_8_ != (Vector<float,_3> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_478 + 8),"\t",1);
          pVVar9 = (pVVar11->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                   .m_ptr;
          pIVar22 = (IVal *)local_4f0;
          pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_478 + 8),(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_478 + 8)," = ",3);
          valueToString<tcu::Matrix<float,3,3>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     (local_298.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),
                     (Matrix<float,_3,_3> *)pIVar22);
          poVar4 = (ostream *)(local_478 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_530._0_8_,CONCAT44(uStack_524,local_530._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,3>>
                    ((string *)(local_4f0 + 0x38),(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)local_1a8,pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &local_520) {
            operator_delete((void *)local_530._0_8_,local_520._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
          pVVar7 = (pVVar11->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pIVar21 = (IVal *)local_4f0;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          poVar4 = (ostream *)(local_478 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     (local_298.out1.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),
                     (Vector<float,_3> *)pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_530._0_8_,CONCAT44(uStack_524,local_530._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    ((string *)(local_4f0 + 0x38),(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)local_268,pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &local_520) {
            operator_delete((void *)local_530._0_8_,local_520._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_478 + 8));
          std::ios_base::~ios_base(local_400);
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_2d0);
    if ((int)local_510 < 0x65) {
      if ((int)local_510 == 0) goto LAB_008795af;
    }
    else {
      local_478._0_8_ = ((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_478 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,(int)local_510 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_400);
    }
    local_478._0_8_ = ((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_478 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,(int)local_510);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_478 + 8));
  std::ios_base::~ios_base(local_400);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_298.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}